

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O1

Vec_Int_t * Vec_WecPushLevel(Vec_Wec_t *p)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  
  uVar1 = p->nCap;
  if (p->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (p->pArray == (Vec_Int_t *)0x0) {
        pVVar2 = (Vec_Int_t *)malloc(0x100);
      }
      else {
        pVVar2 = (Vec_Int_t *)realloc(p->pArray,0x100);
      }
      p->pArray = pVVar2;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar1 * 2;
      if (iVar3 <= (int)uVar1) goto LAB_00783a07;
      if (p->pArray == (Vec_Int_t *)0x0) {
        pVVar2 = (Vec_Int_t *)malloc((ulong)uVar1 << 5);
      }
      else {
        pVVar2 = (Vec_Int_t *)realloc(p->pArray,(ulong)uVar1 << 5);
      }
      p->pArray = pVVar2;
    }
    memset(pVVar2 + p->nCap,0,((long)iVar3 - (long)p->nCap) * 0x10);
    p->nCap = iVar3;
  }
LAB_00783a07:
  iVar3 = p->nSize;
  uVar1 = iVar3 + 1;
  p->nSize = uVar1;
  if (-1 < iVar3) {
    return p->pArray + ((ulong)uVar1 - 1);
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                ,0x9f,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
}

Assistant:

static inline Vec_Int_t * Vec_WecPushLevel( Vec_Wec_t * p )
{
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_WecGrow( p, 16 );
        else
            Vec_WecGrow( p, 2 * p->nCap );
    }
    ++p->nSize;
    return Vec_WecEntryLast( p );
}